

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmoothingGroups.h
# Opt level: O0

void __thiscall FaceWithSmoothingGroup::FaceWithSmoothingGroup(FaceWithSmoothingGroup *this)

{
  FaceWithSmoothingGroup *this_local;
  
  memset(this,0,0xc);
  this->iSmoothGroup = 0;
  this->mIndices[0] = 0xffffffff;
  this->mIndices[1] = 0xffffffff;
  this->mIndices[2] = 0xffffffff;
  return;
}

Assistant:

FaceWithSmoothingGroup() AI_NO_EXCEPT
    : mIndices()
    , iSmoothGroup(0) {
        // in debug builds set all indices to a common magic value
#ifdef ASSIMP_BUILD_DEBUG
        this->mIndices[0] = 0xffffffff;
        this->mIndices[1] = 0xffffffff;
        this->mIndices[2] = 0xffffffff;
#endif
    }